

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# show.hpp
# Opt level: O2

string * __thiscall
lambda::show<std::__cxx11::string>
          (string *__return_storage_ptr__,lambda *this,
          Maybe<std::__cxx11::basic_string<char>_> *maybe)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this[0x20] == (lambda)0x1) {
    std::__cxx11::string::string((string *)&local_70,(string *)this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (local_70 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60) {
      local_50.field_2._8_8_ = uStack_58;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)local_70;
    }
    local_50._M_string_length = local_68;
    local_68 = 0;
    local_60[0] = '\0';
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60;
    std::operator+(&local_30,"Some(",&local_50);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"None",(allocator *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string show(const Maybe<T> maybe) {
    return maybe ? "Some(" + show(*maybe) + ")" : "None";
}